

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall cmOrderDirectories::AddLinkLibrary(cmOrderDirectories *this,string *fullPath)

{
  bool bVar1;
  byte extraout_DL;
  value_type *__x;
  cmOrderDirectories *local_a0;
  unique_ptr<cmOrderDirectoriesConstraintLibrary,_std::default_delete<cmOrderDirectoriesConstraintLibrary>_>
  local_98;
  unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
  local_90 [2];
  cmOrderDirectories *local_80;
  unique_ptr<cmOrderDirectoriesConstraintLibrary,_std::default_delete<cmOrderDirectoriesConstraintLibrary>_>
  local_78;
  unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
  local_70 [3];
  undefined1 local_58 [8];
  string dir;
  string *fullPath_local;
  cmOrderDirectories *this_local;
  
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->LinkExtensions);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!this->LinkExtensions.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmOrderDirectories.cxx"
                  ,0x134,"void cmOrderDirectories::AddLinkLibrary(const std::string &)");
  }
  dir.field_2._8_8_ =
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::insert((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                 *)&this->EmmittedConstraintLibrary,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)fullPath,__x);
  if ((extraout_DL & 1) != 0) {
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->ImplicitDirectories);
    if (!bVar1) {
      cmsys::SystemTools::GetFilenamePath((string *)local_58,fullPath);
      local_90[1]._M_t.
      super___uniq_ptr_impl<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmOrderDirectoriesConstraint_*,_std::default_delete<cmOrderDirectoriesConstraint>_>
      .super__Head_base<0UL,_cmOrderDirectoriesConstraint_*,_false>._M_head_impl._4_1_ =
           IsImplicitDirectory(this,(string *)local_58);
      if (local_90[1]._M_t.
          super___uniq_ptr_impl<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmOrderDirectoriesConstraint_*,_std::default_delete<cmOrderDirectoriesConstraint>_>
          .super__Head_base<0UL,_cmOrderDirectoriesConstraint_*,_false>._M_head_impl._4_1_) {
        local_80 = this;
        std::
        make_unique<cmOrderDirectoriesConstraintLibrary,cmOrderDirectories*,std::__cxx11::string_const&>
                  ((cmOrderDirectories **)&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80);
        std::
        unique_ptr<cmOrderDirectoriesConstraint,std::default_delete<cmOrderDirectoriesConstraint>>::
        unique_ptr<cmOrderDirectoriesConstraintLibrary,std::default_delete<cmOrderDirectoriesConstraintLibrary>,void>
                  ((unique_ptr<cmOrderDirectoriesConstraint,std::default_delete<cmOrderDirectoriesConstraint>>
                    *)local_70,&local_78);
        std::
        vector<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
        ::push_back(&this->ImplicitDirEntries,(value_type *)local_70);
        std::
        unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
        ::~unique_ptr(local_70);
        std::
        unique_ptr<cmOrderDirectoriesConstraintLibrary,_std::default_delete<cmOrderDirectoriesConstraintLibrary>_>
        ::~unique_ptr(&local_78);
      }
      local_90[1]._M_t.
      super___uniq_ptr_impl<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmOrderDirectoriesConstraint_*,_std::default_delete<cmOrderDirectoriesConstraint>_>
      .super__Head_base<0UL,_cmOrderDirectoriesConstraint_*,_false>._M_head_impl._5_3_ = 0;
      std::__cxx11::string::~string((string *)local_58);
      if (local_90[1]._M_t.
          super___uniq_ptr_impl<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmOrderDirectoriesConstraint_*,_std::default_delete<cmOrderDirectoriesConstraint>_>
          .super__Head_base<0UL,_cmOrderDirectoriesConstraint_*,_false>._M_head_impl._4_4_ != 0) {
        return;
      }
    }
    local_a0 = this;
    std::
    make_unique<cmOrderDirectoriesConstraintLibrary,cmOrderDirectories*,std::__cxx11::string_const&>
              ((cmOrderDirectories **)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
    std::unique_ptr<cmOrderDirectoriesConstraint,std::default_delete<cmOrderDirectoriesConstraint>>
    ::
    unique_ptr<cmOrderDirectoriesConstraintLibrary,std::default_delete<cmOrderDirectoriesConstraintLibrary>,void>
              ((unique_ptr<cmOrderDirectoriesConstraint,std::default_delete<cmOrderDirectoriesConstraint>>
                *)local_90,&local_98);
    std::
    vector<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
    ::push_back(&this->ConstraintEntries,(value_type *)local_90);
    std::
    unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>::
    ~unique_ptr(local_90);
    std::
    unique_ptr<cmOrderDirectoriesConstraintLibrary,_std::default_delete<cmOrderDirectoriesConstraintLibrary>_>
    ::~unique_ptr(&local_98);
  }
  return;
}

Assistant:

void cmOrderDirectories::AddLinkLibrary(std::string const& fullPath)
{
  // Link extension info is required for library constraints.
  assert(!this->LinkExtensions.empty());

  // Add the link library at most once.
  if (this->EmmittedConstraintLibrary.insert(fullPath).second) {
    // Implicit link directories need special handling.
    if (!this->ImplicitDirectories.empty()) {
      std::string dir = cmSystemTools::GetFilenamePath(fullPath);
      if (this->IsImplicitDirectory(dir)) {
        this->ImplicitDirEntries.push_back(
          cm::make_unique<cmOrderDirectoriesConstraintLibrary>(this,
                                                               fullPath));
        return;
      }
    }

    // Construct the link library entry.
    this->ConstraintEntries.push_back(
      cm::make_unique<cmOrderDirectoriesConstraintLibrary>(this, fullPath));
  }
}